

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

QString * cleanPackageName(QString *__return_storage_ptr__,QString packageName,bool *cleaned)

{
  long from;
  char16_t cVar1;
  bool bVar2;
  int iVar3;
  iterator pQVar4;
  iterator pQVar5;
  long lVar6;
  QChar *pQVar7;
  ushort ch;
  undefined1 *in_RDX;
  QChar *c;
  QString *__range1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QLatin1StringView latin1_04;
  QLatin1StringView latin1_05;
  QLatin1StringView latin1_06;
  QLatin1StringView latin1_07;
  QLatin1StringView latin1_08;
  QLatin1StringView latin1_09;
  QLatin1StringView latin1_10;
  QLatin1StringView latin1_11;
  QLatin1StringView latin1_12;
  QLatin1StringView latin1_13;
  QLatin1StringView latin1_14;
  QLatin1StringView latin1_15;
  QLatin1StringView latin1_16;
  QLatin1StringView latin1_17;
  QLatin1StringView latin1_18;
  QLatin1StringView latin1_19;
  QLatin1StringView latin1_20;
  QLatin1StringView latin1_21;
  QLatin1StringView latin1_22;
  QLatin1StringView latin1_23;
  QLatin1StringView latin1_24;
  QLatin1StringView latin1_25;
  QLatin1StringView latin1_26;
  QLatin1StringView latin1_27;
  QLatin1StringView latin1_28;
  QLatin1StringView latin1_29;
  QLatin1StringView latin1_30;
  QLatin1StringView latin1_31;
  QLatin1StringView latin1_32;
  QLatin1StringView latin1_33;
  QLatin1StringView latin1_34;
  QLatin1StringView latin1_35;
  QLatin1StringView latin1_36;
  QLatin1StringView latin1_37;
  QLatin1StringView latin1_38;
  QLatin1StringView latin1_39;
  QLatin1StringView latin1_40;
  QLatin1StringView latin1_41;
  QLatin1StringView latin1_42;
  QLatin1StringView latin1_43;
  QLatin1StringView latin1_44;
  QLatin1StringView latin1_45;
  QLatin1StringView latin1_46;
  QLatin1StringView latin1_47;
  QLatin1StringView latin1_48;
  QLatin1String QVar8;
  QArrayDataPointer<char16_t> local_4f0;
  QArrayDataPointer<char16_t> local_4d8;
  QArrayDataPointer<char16_t> local_4c0;
  QArrayDataPointer<char16_t> local_4a8;
  QArrayDataPointer<char16_t> local_490;
  QArrayDataPointer<char16_t> local_478;
  QArrayDataPointer<char16_t> local_460;
  QArrayDataPointer<char16_t> local_448;
  QArrayDataPointer<char16_t> local_430;
  QArrayDataPointer<char16_t> local_418;
  QArrayDataPointer<char16_t> local_400;
  QArrayDataPointer<char16_t> local_3e8;
  QArrayDataPointer<char16_t> local_3d0;
  QArrayDataPointer<char16_t> local_3b8;
  QArrayDataPointer<char16_t> local_3a0;
  QArrayDataPointer<char16_t> local_388;
  QArrayDataPointer<char16_t> local_370;
  QArrayDataPointer<char16_t> local_358;
  QArrayDataPointer<char16_t> local_340;
  QArrayDataPointer<char16_t> local_328;
  QArrayDataPointer<char16_t> local_310;
  QArrayDataPointer<char16_t> local_2f8;
  QArrayDataPointer<char16_t> local_2e0;
  QArrayDataPointer<char16_t> local_2c8;
  QArrayDataPointer<char16_t> local_2b0;
  QArrayDataPointer<char16_t> local_298;
  QArrayDataPointer<char16_t> local_280;
  QArrayDataPointer<char16_t> local_268;
  QArrayDataPointer<char16_t> local_250;
  QArrayDataPointer<char16_t> local_238;
  QArrayDataPointer<char16_t> local_220;
  QArrayDataPointer<char16_t> local_208;
  QArrayDataPointer<char16_t> local_1f0;
  QArrayDataPointer<char16_t> local_1d8;
  QArrayDataPointer<char16_t> local_1c0;
  QArrayDataPointer<char16_t> local_1a8;
  QArrayDataPointer<char16_t> local_190;
  QArrayDataPointer<char16_t> local_178;
  QArrayDataPointer<char16_t> local_160;
  QArrayDataPointer<char16_t> local_148;
  QArrayDataPointer<char16_t> local_130;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_100;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_d0;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX != (undefined1 *)0x0) {
    *in_RDX = 0;
  }
  pQVar4 = QString::begin((QString *)cleaned);
  pQVar5 = QString::end((QString *)cleaned);
  for (; pQVar4 != pQVar5; pQVar4 = pQVar4 + 1) {
    cVar1 = pQVar4->ucs;
    if ((((9 < (ushort)(cVar1 + L'￐')) && (0x19 < (ushort)((cVar1 & 0xffdfU) - 0x41U))) &&
        (cVar1 != L'.')) && ((cVar1 != L'_' && (pQVar4->ucs = L'_', in_RDX != (undefined1 *)0x0))))
    {
      *in_RDX = 1;
    }
  }
  if (cleanPackageName(QString,bool*)::keywords == '\0') {
    iVar3 = __cxa_guard_acquire(&cleanPackageName(QString,bool*)::keywords);
    if (iVar3 != 0) {
      __cxa_atexit(QList<QString>::~QList,&cleanPackageName::keywords,&__dso_handle);
      __cxa_guard_release(&cleanPackageName(QString,bool*)::keywords);
    }
  }
  if (cleanPackageName::keywords.d.size == 0) {
    latin1.m_data = "abstract";
    latin1.m_size = 8;
    QString::QString((QString *)&local_58,latin1);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_58);
    latin1_00.m_data = "continue";
    latin1_00.m_size = 8;
    QString::QString((QString *)&local_70,latin1_00);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_70);
    latin1_01.m_data = "for";
    latin1_01.m_size = 3;
    QString::QString((QString *)&local_88,latin1_01);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_88);
    latin1_02.m_data = "new";
    latin1_02.m_size = 3;
    QString::QString((QString *)&local_a0,latin1_02);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_a0);
    latin1_03.m_data = "switch";
    latin1_03.m_size = 6;
    QString::QString((QString *)&local_b8,latin1_03);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_b8);
    latin1_04.m_data = "assert";
    latin1_04.m_size = 6;
    QString::QString((QString *)&local_d0,latin1_04);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_d0);
    latin1_05.m_data = "default";
    latin1_05.m_size = 7;
    QString::QString((QString *)&local_e8,latin1_05);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_e8);
    latin1_06.m_data = "if";
    latin1_06.m_size = 2;
    QString::QString((QString *)&local_100,latin1_06);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_100);
    latin1_07.m_data = "package";
    latin1_07.m_size = 7;
    QString::QString((QString *)&local_118,latin1_07);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_118);
    latin1_08.m_data = "synchronized";
    latin1_08.m_size = 0xc;
    QString::QString((QString *)&local_130,latin1_08);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_130);
    latin1_09.m_data = "boolean";
    latin1_09.m_size = 7;
    QString::QString((QString *)&local_148,latin1_09);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_148);
    latin1_10.m_data = "do";
    latin1_10.m_size = 2;
    QString::QString((QString *)&local_160,latin1_10);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_160);
    latin1_11.m_data = "goto";
    latin1_11.m_size = 4;
    QString::QString((QString *)&local_178,latin1_11);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_178);
    latin1_12.m_data = "private";
    latin1_12.m_size = 7;
    QString::QString((QString *)&local_190,latin1_12);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_190);
    latin1_13.m_data = "this";
    latin1_13.m_size = 4;
    QString::QString((QString *)&local_1a8,latin1_13);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_1a8);
    latin1_14.m_data = "break";
    latin1_14.m_size = 5;
    QString::QString((QString *)&local_1c0,latin1_14);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_1c0);
    latin1_15.m_data = "double";
    latin1_15.m_size = 6;
    QString::QString((QString *)&local_1d8,latin1_15);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_1d8);
    latin1_16.m_data = "implements";
    latin1_16.m_size = 10;
    QString::QString((QString *)&local_1f0,latin1_16);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_1f0);
    latin1_17.m_data = "protected";
    latin1_17.m_size = 9;
    QString::QString((QString *)&local_208,latin1_17);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_208);
    latin1_18.m_data = "throw";
    latin1_18.m_size = 5;
    QString::QString((QString *)&local_220,latin1_18);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_220);
    latin1_19.m_data = "byte";
    latin1_19.m_size = 4;
    QString::QString((QString *)&local_238,latin1_19);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_238);
    latin1_20.m_data = "else";
    latin1_20.m_size = 4;
    QString::QString((QString *)&local_250,latin1_20);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_250);
    latin1_21.m_data = "import";
    latin1_21.m_size = 6;
    QString::QString((QString *)&local_268,latin1_21);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_268);
    latin1_22.m_data = "public";
    latin1_22.m_size = 6;
    QString::QString((QString *)&local_280,latin1_22);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_280);
    latin1_23.m_data = "throws";
    latin1_23.m_size = 6;
    QString::QString((QString *)&local_298,latin1_23);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_298);
    latin1_24.m_data = "case";
    latin1_24.m_size = 4;
    QString::QString((QString *)&local_2b0,latin1_24);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_2b0);
    latin1_25.m_data = "enum";
    latin1_25.m_size = 4;
    QString::QString((QString *)&local_2c8,latin1_25);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_2c8);
    latin1_26.m_data = "instanceof";
    latin1_26.m_size = 10;
    QString::QString((QString *)&local_2e0,latin1_26);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_2e0);
    latin1_27.m_data = "return";
    latin1_27.m_size = 6;
    QString::QString((QString *)&local_2f8,latin1_27);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_2f8);
    latin1_28.m_data = "transient";
    latin1_28.m_size = 9;
    QString::QString((QString *)&local_310,latin1_28);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_310);
    latin1_29.m_data = "catch";
    latin1_29.m_size = 5;
    QString::QString((QString *)&local_328,latin1_29);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_328);
    latin1_30.m_data = "extends";
    latin1_30.m_size = 7;
    QString::QString((QString *)&local_340,latin1_30);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_340);
    latin1_31.m_data = "int";
    latin1_31.m_size = 3;
    QString::QString((QString *)&local_358,latin1_31);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_358);
    latin1_32.m_data = "short";
    latin1_32.m_size = 5;
    QString::QString((QString *)&local_370,latin1_32);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_370);
    latin1_33.m_data = "try";
    latin1_33.m_size = 3;
    QString::QString((QString *)&local_388,latin1_33);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_388);
    latin1_34.m_data = "char";
    latin1_34.m_size = 4;
    QString::QString((QString *)&local_3a0,latin1_34);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_3a0);
    latin1_35.m_data = "final";
    latin1_35.m_size = 5;
    QString::QString((QString *)&local_3b8,latin1_35);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_3b8);
    latin1_36.m_data = "interface";
    latin1_36.m_size = 9;
    QString::QString((QString *)&local_3d0,latin1_36);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_3d0);
    latin1_37.m_data = "static";
    latin1_37.m_size = 6;
    QString::QString((QString *)&local_3e8,latin1_37);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_3e8);
    latin1_38.m_data = "void";
    latin1_38.m_size = 4;
    QString::QString((QString *)&local_400,latin1_38);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_400);
    latin1_39.m_data = "class";
    latin1_39.m_size = 5;
    QString::QString((QString *)&local_418,latin1_39);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_418);
    latin1_40.m_data = "finally";
    latin1_40.m_size = 7;
    QString::QString((QString *)&local_430,latin1_40);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_430);
    latin1_41.m_data = "long";
    latin1_41.m_size = 4;
    QString::QString((QString *)&local_448,latin1_41);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_448);
    latin1_42.m_data = "strictfp";
    latin1_42.m_size = 8;
    QString::QString((QString *)&local_460,latin1_42);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_460);
    latin1_43.m_data = "volatile";
    latin1_43.m_size = 8;
    QString::QString((QString *)&local_478,latin1_43);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_478);
    latin1_44.m_data = "const";
    latin1_44.m_size = 5;
    QString::QString((QString *)&local_490,latin1_44);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_490);
    latin1_45.m_data = "float";
    latin1_45.m_size = 5;
    QString::QString((QString *)&local_4a8,latin1_45);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_4a8);
    latin1_46.m_data = "native";
    latin1_46.m_size = 6;
    QString::QString((QString *)&local_4c0,latin1_46);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_4c0);
    latin1_47.m_data = "super";
    latin1_47.m_size = 5;
    QString::QString((QString *)&local_4d8,latin1_47);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_4d8);
    latin1_48.m_data = "while";
    latin1_48.m_size = 5;
    QString::QString((QString *)&local_4f0,latin1_48);
    QList<QString>::emplaceBack<QString>(&cleanPackageName::keywords,(QString *)&local_4f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_490);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_478);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_460);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_448);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_430);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_418);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_400);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3d0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_388);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_370);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_358);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_340);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_328);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_310);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2e0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_298);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_280);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_268);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_250);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_238);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_220);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_190);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_160);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_130);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  lVar6 = -1;
  do {
    if (*(long *)(cleaned + 0x10) <= lVar6) {
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)cleaned);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    from = lVar6 + 1;
    lVar6 = QString::indexOf((QString *)cleaned,(QChar)0x2e,from,CaseSensitive);
    if (lVar6 == -1) {
      lVar6 = *(long *)(cleaned + 0x10);
    }
    local_58.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QString::mid((longlong)&local_58,(longlong)cleaned);
    if (local_58.size == 0) {
LAB_0010c43d:
      bVar2 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)&cleanPackageName::keywords,
                         (QString *)&local_58,CaseSensitive);
      if (bVar2) {
        QVar8.m_data = (char *)0x1;
        QVar8.m_size = lVar6;
        QString::insert((longlong)cleaned,QVar8);
        goto LAB_0010c467;
      }
    }
    else {
      pQVar7 = QString::data((QString *)&local_58);
      cVar1 = pQVar7->ucs;
      if (((ushort)cVar1 < 0x30) || (0x39 < (ushort)cVar1 && cVar1 != L'_')) goto LAB_0010c43d;
      QString::insert((longlong)cleaned,(QChar)(char16_t)from);
LAB_0010c467:
      if (in_RDX != (undefined1 *)0x0) {
        *in_RDX = 1;
      }
      lVar6 = lVar6 + 1;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  } while( true );
}

Assistant:

QString cleanPackageName(QString packageName, bool *cleaned = nullptr)
{
    auto isLegalChar = [] (QChar c) -> bool {
        ushort ch = c.unicode();
        return (ch >= '0' && ch <= '9') ||
                (ch >= 'A' && ch <= 'Z') ||
                (ch >= 'a' && ch <= 'z') ||
                ch == '.' || ch == '_';
    };

    if (cleaned)
        *cleaned = false;

    for (QChar &c : packageName) {
        if (!isLegalChar(c)) {
            c = u'_';
            if (cleaned)
                *cleaned = true;
        }
    }

    static QStringList keywords;
    if (keywords.isEmpty()) {
        keywords << "abstract"_L1 << "continue"_L1 << "for"_L1
                 << "new"_L1 << "switch"_L1 << "assert"_L1
                 << "default"_L1 << "if"_L1 << "package"_L1
                 << "synchronized"_L1 << "boolean"_L1 << "do"_L1
                 << "goto"_L1 << "private"_L1 << "this"_L1
                 << "break"_L1 << "double"_L1 << "implements"_L1
                 << "protected"_L1 << "throw"_L1 << "byte"_L1
                 << "else"_L1 << "import"_L1 << "public"_L1
                 << "throws"_L1 << "case"_L1 << "enum"_L1
                 << "instanceof"_L1 << "return"_L1 << "transient"_L1
                 << "catch"_L1 << "extends"_L1 << "int"_L1
                 << "short"_L1 << "try"_L1 << "char"_L1
                 << "final"_L1 << "interface"_L1 << "static"_L1
                 << "void"_L1 << "class"_L1 << "finally"_L1
                 << "long"_L1 << "strictfp"_L1 << "volatile"_L1
                 << "const"_L1 << "float"_L1 << "native"_L1
                 << "super"_L1 << "while"_L1;
    }

    // No keywords
    qsizetype index = -1;
    while (index < packageName.size()) {
        qsizetype next = packageName.indexOf(u'.', index + 1);
        if (next == -1)
            next = packageName.size();
        QString word = packageName.mid(index + 1, next - index - 1);
        if (!word.isEmpty()) {
            QChar c = word[0];
            if ((c >= u'0' && c <= u'9') || c == u'_') {
                packageName.insert(index + 1, u'a');
                if (cleaned)
                    *cleaned = true;
                index = next + 1;
                continue;
            }
        }
        if (keywords.contains(word)) {
            packageName.insert(next, "_"_L1);
            if (cleaned)
                *cleaned = true;
            index = next + 1;
        } else {
            index = next;
        }
    }

    return packageName;
}